

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void encode_field(upb_encstate *e,upb_Message *msg,upb_MiniTableSubInternal *subs,
                 upb_MiniTableField *field)

{
  upb_FieldMode uVar1;
  upb_MiniTableField *field_local;
  upb_MiniTableSubInternal *subs_local;
  upb_Message *msg_local;
  upb_encstate *e_local;
  
  uVar1 = _upb_MiniTableField_Mode_dont_copy_me__upb_internal_use_only(field);
  if (uVar1 == kUpb_FieldMode_Map) {
    encode_map(e,msg,subs,field);
  }
  else if (uVar1 == kUpb_FieldMode_Array) {
    encode_array(e,msg,subs,field);
  }
  else {
    if (uVar1 != kUpb_FieldMode_Scalar) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/wire/encode.c"
                    ,0x20a,
                    "void encode_field(upb_encstate *, const upb_Message *, const upb_MiniTableSubInternal *, const upb_MiniTableField *)"
                   );
    }
    encode_scalar(e,(void *)((long)&msg->field_0 +
                            (long)(int)(uint)field->offset_dont_copy_me__upb_internal_use_only),subs
                  ,field);
  }
  return;
}

Assistant:

static void encode_field(upb_encstate* e, const upb_Message* msg,
                         const upb_MiniTableSubInternal* subs,
                         const upb_MiniTableField* field) {
  switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(field)) {
    case kUpb_FieldMode_Array:
      encode_array(e, msg, subs, field);
      break;
    case kUpb_FieldMode_Map:
      encode_map(e, msg, subs, field);
      break;
    case kUpb_FieldMode_Scalar:
      encode_scalar(e, UPB_PTR_AT(msg, field->UPB_PRIVATE(offset), void), subs,
                    field);
      break;
    default:
      UPB_UNREACHABLE();
  }
}